

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PackageImportDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PackageImportDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *args_2,
          Token *args_3)

{
  Token keyword;
  PackageImportDeclarationSyntax *pPVar1;
  PackageImportDeclarationSyntax *in_RCX;
  long in_RDX;
  Info *in_RSI;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_R8;
  Token in_stack_00000000;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  pPVar1 = (PackageImportDeclarationSyntax *)
           allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  keyword.info = in_RSI;
  keyword.kind = (short)in_RDX;
  keyword._2_1_ = (char)((ulong)in_RDX >> 0x10);
  keyword.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  keyword.rawLen = (int)((ulong)in_RDX >> 0x20);
  slang::syntax::PackageImportDeclarationSyntax::PackageImportDeclarationSyntax
            (in_RCX,in_R8,keyword,
             *(SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> **)(in_RDX + 8),
             in_stack_00000000);
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }